

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void externalSubsetDebug(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  callbacks = callbacks + 1;
  if (noout != 0) {
    return;
  }
  fprintf(_stdout,"SAX.externalSubset(%s,",name);
  if (ExternalID == (xmlChar *)0x0) {
    fwrite(" ,",2,1,_stdout);
  }
  else {
    fprintf(_stdout," %s,",ExternalID);
  }
  if (SystemID != (xmlChar *)0x0) {
    fprintf(_stdout," %s)\n",SystemID);
    return;
  }
  fwrite(" )\n",3,1,_stdout);
  return;
}

Assistant:

static void
externalSubsetDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    callbacks++;
    if (noout)
	return;
    fprintf(stdout, "SAX.externalSubset(%s,", name);
    if (ExternalID == NULL)
	fprintf(stdout, " ,");
    else
	fprintf(stdout, " %s,", ExternalID);
    if (SystemID == NULL)
	fprintf(stdout, " )\n");
    else
	fprintf(stdout, " %s)\n", SystemID);
}